

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transaction.cpp
# Opt level: O3

ssize_t __thiscall Transaction::write(Transaction *this,int __fd,void *__buf,size_t __n)

{
  int local_4;
  
  (this->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[__fd] = (int)__buf;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->writeSet,&local_4);
  return 0;
}

Assistant:

int Transaction::write(const int data_item, int value) {
    local_write_store[data_item] = value;
    writeSet.insert(data_item);
    return 0;

}